

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void Catch::setOrder(ConfigData *config,string *order)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  InWhatOrder IVar3;
  runtime_error *this;
  long *plVar4;
  size_type *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"declared","");
  bVar2 = startsWith(&local_48,order);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  IVar3 = InDeclarationOrder;
  if (!bVar2) {
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"lexical","");
    bVar2 = startsWith(&local_48,order);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    IVar3 = InLexicographicalOrder;
    if (!bVar2) {
      local_48._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"random","");
      bVar2 = startsWith(&local_48,order);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != paVar1) {
        operator_delete(local_48._M_dataplus._M_p);
      }
      IVar3 = InRandomOrder;
      if (!bVar2) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_68,"Unrecognised ordering: \'",order);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_68);
        local_48._M_dataplus._M_p = (pointer)*plVar4;
        psVar5 = (size_type *)(plVar4 + 2);
        if ((size_type *)local_48._M_dataplus._M_p == psVar5) {
          local_48.field_2._M_allocated_capacity = *psVar5;
          local_48.field_2._8_8_ = plVar4[3];
          local_48._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_48.field_2._M_allocated_capacity = *psVar5;
        }
        local_48._M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::runtime_error::runtime_error(this,(string *)&local_48);
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  config->runOrder = IVar3;
  return;
}

Assistant:

inline void setOrder(ConfigData& config, std::string const& order) {
		if (startsWith("declared", order))
			config.runOrder = RunTests::InDeclarationOrder;
		else if (startsWith("lexical", order))
			config.runOrder = RunTests::InLexicographicalOrder;
		else if (startsWith("random", order))
			config.runOrder = RunTests::InRandomOrder;
		else
			throw std::runtime_error("Unrecognised ordering: '" + order + "'");
	}